

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void print_set_debug(lyxp_set *set)

{
  longdouble lVar1;
  lyxp_node_type lVar2;
  uint uVar3;
  int iVar4;
  lyxp_set_node *plVar5;
  char *pcVar6;
  short sStack_50;
  short sStack_40;
  lyxp_set_snode *sitem;
  lyxp_set_node *item;
  char *str_num;
  lyxp_set *plStack_10;
  uint32_t i;
  lyxp_set *set_local;
  
  if (ly_log_level < 3) {
    return;
  }
  plStack_10 = set;
  switch(set->type) {
  case LYXP_SET_EMPTY:
    ly_log_dbg(8,"set EMPTY");
    break;
  case LYXP_SET_NODE_SET:
    ly_log_dbg(8,"set NODE SET:");
    for (str_num._4_4_ = 0; str_num._4_4_ < plStack_10->used; str_num._4_4_ = str_num._4_4_ + 1) {
      plVar5 = (plStack_10->val).nodes + str_num._4_4_;
      switch(plVar5->type) {
      case LYXP_NODE_ROOT:
        ly_log_dbg(8,"\t%d (pos %u): ROOT",(ulong)(str_num._4_4_ + 1),(ulong)plVar5->pos);
        break;
      case LYXP_NODE_ROOT_CONFIG:
        ly_log_dbg(8,"\t%d (pos %u): ROOT CONFIG",(ulong)(str_num._4_4_ + 1),(ulong)plVar5->pos);
        break;
      case LYXP_NODE_ELEM:
        if ((plVar5->node->schema->nodetype == LYS_LIST) &&
           (plVar5->node->child->schema->nodetype == LYS_LEAF)) {
          ly_log_dbg(8,"\t%d (pos %u): ELEM %s (1st child val: %s)",(ulong)(str_num._4_4_ + 1),
                     (ulong)plVar5->pos,plVar5->node->schema->name,plVar5->node->child->ht);
        }
        else if (plVar5->node->schema->nodetype == LYS_LEAFLIST) {
          ly_log_dbg(8,"\t%d (pos %u): ELEM %s (val: %s)",(ulong)(str_num._4_4_ + 1),
                     (ulong)plVar5->pos,plVar5->node->schema->name,plVar5->node->ht);
        }
        else {
          ly_log_dbg(8,"\t%d (pos %u): ELEM %s",(ulong)(str_num._4_4_ + 1),(ulong)plVar5->pos,
                     plVar5->node->schema->name);
        }
        break;
      case LYXP_NODE_TEXT:
        if ((plVar5->node->schema->nodetype & LYS_ANYDATA) == LYS_UNKNOWN) {
          ly_log_dbg(8,"\t%d (pos %u): TEXT %s",(ulong)(str_num._4_4_ + 1),(ulong)plVar5->pos,
                     plVar5->node->ht);
        }
        else {
          pcVar6 = "anydata";
          if (plVar5->node->schema->nodetype == LYS_ANYXML) {
            pcVar6 = "anyxml";
          }
          ly_log_dbg(8,"\t%d (pos %u): TEXT <%s>",(ulong)(str_num._4_4_ + 1),(ulong)plVar5->pos,
                     pcVar6);
        }
        break;
      case LYXP_NODE_ATTR:
        ly_log_dbg(8,"\t%d (pos %u): ATTR %s = %s",(ulong)(str_num._4_4_ + 1),(ulong)plVar5->pos,
                   ((plStack_10->val).nodes[str_num._4_4_].node)->next,
                   ((plStack_10->val).nodes[str_num._4_4_].node)->parent);
      }
    }
    break;
  case LYXP_SET_SNODE_SET:
    ly_log_dbg(8,"set SNODE SET:");
    for (str_num._4_4_ = 0; str_num._4_4_ < plStack_10->used; str_num._4_4_ = str_num._4_4_ + 1) {
      plVar5 = (plStack_10->val).nodes + str_num._4_4_;
      lVar2 = plVar5->type;
      if (lVar2 == LYXP_NODE_ROOT) {
        ly_log_dbg(8,"\t%d (%u): ROOT",(ulong)(str_num._4_4_ + 1),(ulong)plVar5->pos);
      }
      else if (lVar2 == LYXP_NODE_ROOT_CONFIG) {
        ly_log_dbg(8,"\t%d (%u): ROOT CONFIG",(ulong)(str_num._4_4_ + 1),(ulong)plVar5->pos);
      }
      else if (lVar2 == LYXP_NODE_ELEM) {
        ly_log_dbg(8,"\t%d (%u): ELEM %s",(ulong)(str_num._4_4_ + 1),(ulong)plVar5->pos,
                   plVar5->node->schema);
      }
      else {
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
               ,0x107);
      }
    }
    break;
  case LYXP_SET_BOOLEAN:
    ly_log_dbg(8,"set BOOLEAN");
    pcVar6 = "false";
    if ((plStack_10->val).bool != 0) {
      pcVar6 = "true";
    }
    ly_log_dbg(8,"\t%s",pcVar6);
    break;
  case LYXP_SET_NUMBER:
    ly_log_dbg(8,"set NUMBER");
    if (NAN((plStack_10->val).num)) {
      item = (lyxp_set_node *)strdup("NaN");
    }
    else {
      if (((plStack_10->val).num != (longdouble)0) ||
         (NAN((plStack_10->val).num) || NAN((longdouble)0))) {
        if (((plStack_10->val).num != -(longdouble)0) ||
           (NAN((plStack_10->val).num) || NAN(-(longdouble)0))) {
          sStack_40 = (short)((unkuint10)(plStack_10->val).num >> 0x40);
          uVar3 = 0;
          if ((longdouble)INFINITY <= ABS((plStack_10->val).num)) {
            uVar3 = (uint)((ulong)(long)sStack_40 >> 0xf) | 1;
          }
          if ((uVar3 == 0) || (*(short *)((long)&plStack_10->val + 8) < 0)) {
            sStack_50 = (short)((unkuint10)(plStack_10->val).num >> 0x40);
            uVar3 = 0;
            if ((longdouble)INFINITY <= ABS((plStack_10->val).num)) {
              uVar3 = (uint)((ulong)(long)sStack_50 >> 0xf) | 1;
            }
            if ((uVar3 == 0) || (-1 < *(short *)((long)&plStack_10->val + 8))) {
              lVar1 = (plStack_10->val).num;
              if (((longdouble)(long)ROUND(lVar1) != lVar1) ||
                 (NAN((longdouble)(long)ROUND(lVar1)) || NAN(lVar1))) {
                iVar4 = asprintf((char **)&item,"%03.1Lf");
                if (iVar4 == -1) {
                  item = (lyxp_set_node *)0x0;
                }
              }
              else {
                iVar4 = asprintf((char **)&item,"%lld",(long)ROUND((plStack_10->val).num));
                if (iVar4 == -1) {
                  item = (lyxp_set_node *)0x0;
                }
              }
            }
            else {
              item = (lyxp_set_node *)strdup("-Infinity");
            }
          }
          else {
            item = (lyxp_set_node *)strdup("Infinity");
          }
          goto LAB_001b91e3;
        }
      }
      item = (lyxp_set_node *)strdup("0");
    }
LAB_001b91e3:
    if (item == (lyxp_set_node *)0x0) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","print_set_debug");
    }
    else {
      ly_log_dbg(8,"\t%s",item);
      free(item);
    }
    break;
  case LYXP_SET_STRING:
    ly_log_dbg(8,"set STRING");
    ly_log_dbg(8,"\t%s",(plStack_10->val).nodes);
  }
  return;
}

Assistant:

static void
print_set_debug(struct lyxp_set *set)
{
    uint32_t i;
    char *str_num;
    struct lyxp_set_node *item;
    struct lyxp_set_snode *sitem;

    if (ly_log_level < LY_LLDBG) {
        return;
    }

    switch (set->type) {
    case LYXP_SET_NODE_SET:
        LOGDBG(LY_LDGXPATH, "set NODE SET:");
        for (i = 0; i < set->used; ++i) {
            item = &set->val.nodes[i];

            switch (item->type) {
            case LYXP_NODE_ROOT:
                LOGDBG(LY_LDGXPATH, "\t%d (pos %u): ROOT", i + 1, item->pos);
                break;
            case LYXP_NODE_ROOT_CONFIG:
                LOGDBG(LY_LDGXPATH, "\t%d (pos %u): ROOT CONFIG", i + 1, item->pos);
                break;
            case LYXP_NODE_ELEM:
                if ((item->node->schema->nodetype == LYS_LIST)
                        && (item->node->child->schema->nodetype == LYS_LEAF)) {
                    LOGDBG(LY_LDGXPATH, "\t%d (pos %u): ELEM %s (1st child val: %s)", i + 1, item->pos,
                           item->node->schema->name,
                           ((struct lyd_node_leaf_list *)item->node->child)->value_str);
                } else if (item->node->schema->nodetype == LYS_LEAFLIST) {
                    LOGDBG(LY_LDGXPATH, "\t%d (pos %u): ELEM %s (val: %s)", i + 1, item->pos,
                           item->node->schema->name,
                           ((struct lyd_node_leaf_list *)item->node)->value_str);
                } else {
                    LOGDBG(LY_LDGXPATH, "\t%d (pos %u): ELEM %s", i + 1, item->pos, item->node->schema->name);
                }
                break;
            case LYXP_NODE_TEXT:
                if (item->node->schema->nodetype & LYS_ANYDATA) {
                    LOGDBG(LY_LDGXPATH, "\t%d (pos %u): TEXT <%s>", i + 1, item->pos,
                           item->node->schema->nodetype == LYS_ANYXML ? "anyxml" : "anydata");
                } else {
                    LOGDBG(LY_LDGXPATH, "\t%d (pos %u): TEXT %s", i + 1, item->pos,
                           ((struct lyd_node_leaf_list *)item->node)->value_str);
                }
                break;
            case LYXP_NODE_ATTR:
                LOGDBG(LY_LDGXPATH, "\t%d (pos %u): ATTR %s = %s", i + 1, item->pos, set->val.attrs[i].attr->name,
                       set->val.attrs[i].attr->value);
                break;
            }
        }
        break;

    case LYXP_SET_SNODE_SET:
        LOGDBG(LY_LDGXPATH, "set SNODE SET:");
        for (i = 0; i < set->used; ++i) {
            sitem = &set->val.snodes[i];

            switch (sitem->type) {
            case LYXP_NODE_ROOT:
                LOGDBG(LY_LDGXPATH, "\t%d (%u): ROOT", i + 1, sitem->in_ctx);
                break;
            case LYXP_NODE_ROOT_CONFIG:
                LOGDBG(LY_LDGXPATH, "\t%d (%u): ROOT CONFIG", i + 1, sitem->in_ctx);
                break;
            case LYXP_NODE_ELEM:
                LOGDBG(LY_LDGXPATH, "\t%d (%u): ELEM %s", i + 1, sitem->in_ctx, sitem->snode->name);
                break;
            default:
                LOGINT(NULL);
                break;
            }
        }
        break;

    case LYXP_SET_EMPTY:
        LOGDBG(LY_LDGXPATH, "set EMPTY");
        break;

    case LYXP_SET_BOOLEAN:
        LOGDBG(LY_LDGXPATH, "set BOOLEAN");
        LOGDBG(LY_LDGXPATH, "\t%s", (set->val.bool ? "true" : "false"));
        break;

    case LYXP_SET_STRING:
        LOGDBG(LY_LDGXPATH, "set STRING");
        LOGDBG(LY_LDGXPATH, "\t%s", set->val.str);
        break;

    case LYXP_SET_NUMBER:
        LOGDBG(LY_LDGXPATH, "set NUMBER");

        if (isnan(set->val.num)) {
            str_num = strdup("NaN");
        } else if ((set->val.num == 0) || (set->val.num == -0.0f)) {
            str_num = strdup("0");
        } else if (isinf(set->val.num) && !signbit(set->val.num)) {
            str_num = strdup("Infinity");
        } else if (isinf(set->val.num) && signbit(set->val.num)) {
            str_num = strdup("-Infinity");
        } else if ((long long)set->val.num == set->val.num) {
            if (asprintf(&str_num, "%lld", (long long)set->val.num) == -1) {
                str_num = NULL;
            }
        } else {
            if (asprintf(&str_num, "%03.1Lf", set->val.num) == -1) {
                str_num = NULL;
            }
        }
        LY_CHECK_ERR_RETURN(!str_num, LOGMEM(NULL), );

        LOGDBG(LY_LDGXPATH, "\t%s", str_num);
        free(str_num);
    }
}